

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdBindPipeline(CommandBuffer *this,Ptr<PipelineBase> *pipeline)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdBindPipeline UNRECOVERED_JUMPTABLE;
  VkPipelineBindPoint VVar2;
  
  UNRECOVERED_JUMPTABLE = vkCmdBindPipeline;
  pVVar1 = this->m_command_buffer;
  VVar2 = (*(((pipeline->super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_DeviceObjectBase).super_Base._vptr_Base[3])();
  (*UNRECOVERED_JUMPTABLE)
            (pVVar1,VVar2,
             ((pipeline->super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->m_pipeline);
  return;
}

Assistant:

void CommandBuffer::CmdBindPipeline(const Ptr<PipelineBase> &pipeline) const {
	vkCmdBindPipeline(m_command_buffer, pipeline->GetBindPoint(), pipeline->GetHandle());
}